

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_main.cpp
# Opt level: O1

void D_Display(void)

{
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  FFont *font;
  DFrameBuffer *this;
  undefined8 *puVar5;
  char hw2d;
  int iVar6;
  uint uVar7;
  int iVar8;
  FTextureID FVar9;
  long lVar10;
  long *plVar11;
  FTexture *pFVar12;
  undefined8 *puVar13;
  uint uVar14;
  byte bVar15;
  EHudState state;
  timespec ts;
  DAngle local_38;
  
  if (nodrawers) {
    return;
  }
  if (screen == (DFrameBuffer *)0x0) {
    return;
  }
  clock_gettime(1,(timespec *)&ts);
  lVar10 = (long)consoleplayer;
  plVar11 = &DAT_017e5fc8 + lVar10 * 0x54;
  if (*plVar11 == 0) {
LAB_0036695d:
    (&DAT_017e5fc8)[lVar10 * 0x54] = (&players)[lVar10 * 0x54];
  }
  else if ((*(byte *)(*plVar11 + 0x20) & 0x20) != 0) {
    *plVar11 = 0;
    goto LAB_0036695d;
  }
  dVar2 = (double)ts.tv_nsec;
  dVar3 = (double)ts.tv_sec;
  if (viewactive == true) {
    local_38.Degrees = 90.0;
    if (*plVar11 != 0) {
      if ((*(byte *)(*plVar11 + 0x20) & 0x20) == 0) {
        local_38.Degrees = 90.0;
        if (*(long *)(*plVar11 + 0x230) != 0) {
          local_38.Degrees = (double)*(float *)(*(long *)(*plVar11 + 0x230) + 0x5c);
        }
      }
      else {
        *plVar11 = 0;
        local_38.Degrees = 90.0;
      }
    }
    R_SetFOV(&local_38);
  }
  if ((setmodeneeded == true) &&
     (iVar6 = (*Video->_vptr_IVideo[7])
                        (Video,(ulong)(uint)NewWidth,(ulong)(uint)NewHeight,(ulong)(uint)NewBits),
     (char)iVar6 != '\0')) {
    setsizeneeded = true;
    if (StatusBar != (DBaseStatusBar *)0x0) {
      (*(StatusBar->super_DObject)._vptr_DObject[0xe])();
    }
    C_NewModeAdjust();
    ST_LoadCrosshair(true);
    AM_NewResolution();
    if (vid_cursor.super_FBaseCVar.m_Callback != (_func_void_FBaseCVar_ptr *)0x0) {
      (*vid_cursor.super_FBaseCVar.m_Callback)(&vid_cursor.super_FBaseCVar);
    }
  }
  RenderTarget = (DCanvas *)screen;
  if ((setsizeneeded == true) && (StatusBar != (DBaseStatusBar *)0x0)) {
    R_ExecuteSetViewSize();
  }
  setmodeneeded = false;
  iVar6 = (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[8])(screen,0);
  if ((char)iVar6 != '\0') {
    ST_SetNeedRefresh();
    V_SetBorderNeedRefresh();
  }
  if (NoWipe == 0) {
    bVar15 = 1;
    if (((gamestate != wipegamestate) && (gamestate != GS_FULLCONSOLE)) &&
       (gamestate != GS_TITLELEVEL)) {
      V_SetBorderNeedRefresh();
      uVar7 = wipetype.Value;
      if ((uint)(wipegamestate + GS_FULLCONSOLE) < 3) {
        uVar7 = wipegamestate + GS_HIDECONSOLE;
      }
      iVar6 = (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x2a])
                        (screen,(ulong)uVar7);
      wipegamestate = gamestate;
      bVar15 = (byte)iVar6 ^ 1;
    }
  }
  else {
    V_SetBorderNeedRefresh();
    NoWipe = NoWipe + -1;
    wipegamestate = gamestate;
    bVar15 = 1;
  }
  uVar7 = I_FPSTime();
  FTextureManager::UpdateAnimations(&TexMan,uVar7);
  R_UpdateSky(uVar7);
  bVar4 = true;
  hw2d = false;
  switch(gamestate) {
  case GS_LEVEL:
  case GS_TITLELEVEL:
    if (gametic == 0) {
      hw2d = false;
    }
    else {
      if (StatusBar != (DBaseStatusBar *)0x0) {
        ts.tv_sec = 0;
        ts.tv_nsec = 0;
        (*(StatusBar->super_DObject)._vptr_DObject[0xc])();
      }
      (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x24])();
      (*Renderer->_vptr_FRenderer[4])(Renderer,&players + (long)consoleplayer * 0x54);
      iVar6 = (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x25])();
      hw2d = (char)iVar6;
      if (hw2d != '\0') {
        ST_SetNeedRefresh();
        V_SetBorderNeedRefresh();
      }
      (*Renderer->_vptr_FRenderer[7])();
      (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x26])();
      iVar6 = ST_Y;
      if (automapactive == true) {
        if ((hud_althud.Value == true) &&
           (viewheight == (screen->super_DSimpleCanvas).super_DCanvas.Height)) {
          ST_Y = viewheight;
        }
        AM_Drawer();
      }
      ST_Y = iVar6;
      if ((automapactive != true) || (viewactive == true)) {
        V_RefreshViewBorder();
      }
      if (((hud_althud.Value == true) &&
          (viewheight == (screen->super_DSimpleCanvas).super_DCanvas.Height)) &&
         (10 < screenblocks.Value)) {
        state = HUD_AltHud;
        DBaseStatusBar::DrawBottomStuff(StatusBar,HUD_AltHud);
        if ((DrawFSHUD != false) || (automapactive == true)) {
          DrawHUD();
        }
      }
      else {
        if (((viewheight == (screen->super_DSimpleCanvas).super_DCanvas.Height) &&
            (viewactive == true)) && (10 < screenblocks.Value)) {
          state = HUD_None - DrawFSHUD;
        }
        else {
          state = HUD_StatusBar;
        }
        DBaseStatusBar::DrawBottomStuff(StatusBar,state);
      }
      (*(StatusBar->super_DObject)._vptr_DObject[8])(StatusBar,(ulong)state);
      DBaseStatusBar::DrawTopStuff(StatusBar,state);
      CT_Drawer();
    }
    goto switchD_00366b6c_caseD_5;
  case GS_INTERMISSION:
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x24])(screen,0,0,0,0)
    ;
    iVar6 = (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x25])
                      (screen,0);
    hw2d = (char)iVar6;
    WI_Drawer();
    break;
  case GS_FINALE:
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x24])(screen,0,0,0,0)
    ;
    iVar6 = (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x25])
                      (screen,0);
    hw2d = (char)iVar6;
    F_Drawer();
    break;
  case GS_DEMOSCREEN:
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x24])(screen,0,0,0,0)
    ;
    iVar6 = (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x25])
                      (screen,0);
    hw2d = (char)iVar6;
    D_PageDrawer();
    break;
  case GS_FULLCONSOLE:
    bVar4 = false;
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x24])(screen,0,0,0,0)
    ;
    iVar6 = (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x25])
                      (screen,0);
    hw2d = (char)iVar6;
    C_DrawConsole(false);
    M_Drawer();
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x19])();
  default:
    goto switchD_00366b6c_caseD_5;
  }
  CT_Drawer();
switchD_00366b6c_caseD_5:
  if (bVar4) {
    if (((paused != 0) || (pauseext == true)) && (menuactive == MENU_Off)) {
      FString::FString((FString *)&ts,"By ");
      pFVar12 = FTextureManager::operator()(&TexMan,gameinfo.PauseSign.Chars);
      dVar1 = (pFVar12->Scale).X;
      uVar7 = (uint)((double)((uint)pFVar12->Width * 2) / dVar1);
      uVar14 = (uint)((double)(pFVar12->LeftOffset * 2) / dVar1);
      DCanvas::DrawTexture
                ((DCanvas *)screen,pFVar12,
                 (double)(int)(((uVar14 & 1) + ((int)uVar14 >> 1)) * CleanXfac +
                              (int)((screen->super_DSimpleCanvas).super_DCanvas.Width -
                                   ((uVar7 & 1) + ((int)uVar7 >> 1)) * CleanXfac) / 2),4.0,
                 0x40001393,1,0);
      lVar10 = (long)paused;
      if ((lVar10 != 0) && (multiplayer == true)) {
        puVar5 = (undefined8 *)
                 ((long)&((&pr_pspawn)[lVar10 * 6].Next)->Name +
                 (ulong)(((&pr_pspawn)[lVar10 * 6].sfmt.u[0] - 1 & 0x1ea) * 0x18));
        do {
          puVar13 = puVar5;
          puVar5 = (undefined8 *)*puVar13;
        } while (*(int *)(puVar13 + 1) != 0x1ea);
        FString::operator+=((FString *)&ts,*(char **)(puVar13[2] + 0x28));
        this = screen;
        font = SmallFont;
        iVar6 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
        iVar8 = FFont::StringWidth(SmallFont,(BYTE *)ts.tv_sec);
        uVar7 = (uint)((double)((uint)pFVar12->Height * 2) / (pFVar12->Scale).Y);
        DCanvas::DrawText((DCanvas *)this,font,6,(iVar6 - iVar8 * CleanXfac) / 2,
                          ((uVar7 & 1) + ((int)uVar7 >> 1)) * CleanYfac + 4,(char *)ts.tv_sec,
                          0x40001393,1,0);
      }
      FString::~FString((FString *)&ts);
    }
    if (D_DrawIcon != (char *)0x0) {
      FVar9 = FTextureManager::CheckForTexture(&TexMan,D_DrawIcon,8,1);
      D_DrawIcon = (char *)0x0;
      if (0 < FVar9.texnum) {
        pFVar12 = TexMan.Textures.Array[(uint)FVar9.texnum].Texture;
        uVar7 = (uint)((double)((uint)pFVar12->Width * 2) / (pFVar12->Scale).X);
        uVar14 = (uint)((double)((uint)pFVar12->Height * 2) / (pFVar12->Scale).Y);
        DCanvas::DrawTexture
                  ((DCanvas *)screen,pFVar12,
                   (double)(0xa0 - (int)((uVar7 & 1) + ((int)uVar7 >> 1)) / 2),
                   (double)(100 - (int)((uVar14 & 1) + ((int)uVar14 >> 1)) / 2),0x40001391,1,0);
      }
      NoWipe = 10;
    }
    if (snd_drawoutput.Value != 0) {
      (*GSnd->_vptr_SoundRenderer[0x20])();
    }
    if ((bVar15 | NoWipe < 0) == 1) {
      NetUpdate();
      C_DrawConsole((bool)hw2d);
      M_Drawer();
      FStat::PrintStat();
      (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x19])();
    }
    else {
      (*GSnd->_vptr_SoundRenderer[0x16])(GSnd,1,1);
      (*I_FreezeTime)(true);
      (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x2b])();
      uVar7 = I_MSTime();
      NetUpdate();
      do {
        do {
          I_WaitVBL(2);
          uVar14 = I_MSTime();
        } while ((uVar14 - uVar7) * 0x28 < 1000);
        iVar6 = (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x2c])
                          (screen,1);
        C_DrawConsole((bool)hw2d);
        M_Drawer();
        (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x19])();
        NetUpdate();
        uVar7 = uVar14;
      } while ((char)iVar6 == '\0');
      (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x2d])();
      (*I_FreezeTime)(false);
      (*GSnd->_vptr_SoundRenderer[0x16])(GSnd,0,1);
    }
    clock_gettime(1,(timespec *)&ts);
    FrameCycles.Sec =
         (0.0 - (dVar2 * 1e-09 + dVar3)) + (double)ts.tv_nsec * 1e-09 + (double)ts.tv_sec;
  }
  return;
}

Assistant:

void D_Display ()
{
	bool wipe;
	bool hw2d;

	if (nodrawers || screen == NULL)
		return; 				// for comparative timing / profiling
	
	cycle_t cycles;
	
	cycles.Reset();
	cycles.Clock();

	if (players[consoleplayer].camera == NULL)
	{
		players[consoleplayer].camera = players[consoleplayer].mo;
	}

	if (viewactive)
	{
		R_SetFOV (players[consoleplayer].camera && players[consoleplayer].camera->player ?
			players[consoleplayer].camera->player->FOV : 90.f);
	}

	// [RH] change the screen mode if needed
	if (setmodeneeded)
	{
		// Change screen mode.
		if (Video->SetResolution (NewWidth, NewHeight, NewBits))
		{
			// Recalculate various view parameters.
			setsizeneeded = true;
			// Let the status bar know the screen size changed
			if (StatusBar != NULL)
			{
				StatusBar->ScreenSizeChanged ();
			}
			// Refresh the console.
			C_NewModeAdjust ();
			// Reload crosshair if transitioned to a different size
			ST_LoadCrosshair (true);
			AM_NewResolution ();
			// Reset the mouse cursor in case the bit depth changed
			vid_cursor.Callback();
		}
	}

	RenderTarget = screen;

	// change the view size if needed
	if (setsizeneeded && StatusBar != NULL)
	{
		R_ExecuteSetViewSize ();
	}
	setmodeneeded = false;

	if (screen->Lock (false))
	{
		ST_SetNeedRefresh();
		V_SetBorderNeedRefresh();
	}

	// [RH] Allow temporarily disabling wipes
	if (NoWipe)
	{
		V_SetBorderNeedRefresh();
		NoWipe--;
		wipe = false;
		wipegamestate = gamestate;
	}
	else if (gamestate != wipegamestate && gamestate != GS_FULLCONSOLE && gamestate != GS_TITLELEVEL)
	{ // save the current screen if about to wipe
		V_SetBorderNeedRefresh();
		switch (wipegamestate)
		{
		default:
			wipe = screen->WipeStartScreen (wipetype);
			break;

		case GS_FORCEWIPEFADE:
			wipe = screen->WipeStartScreen (wipe_Fade);
			break;

		case GS_FORCEWIPEBURN:
			wipe = screen->WipeStartScreen (wipe_Burn);
			break;

		case GS_FORCEWIPEMELT:
			wipe = screen->WipeStartScreen (wipe_Melt);
			break;
		}
		wipegamestate = gamestate;
	}
	else
	{
		wipe = false;
	}

	hw2d = false;


	{
		unsigned int nowtime = I_FPSTime();
		TexMan.UpdateAnimations(nowtime);
		R_UpdateSky(nowtime);
		switch (gamestate)
		{
		case GS_FULLCONSOLE:
			screen->SetBlendingRect(0,0,0,0);
			hw2d = screen->Begin2D(false);
			C_DrawConsole (false);
			M_Drawer ();
			screen->Update ();
			return;

		case GS_LEVEL:
		case GS_TITLELEVEL:
			if (!gametic)
				break;

			if (StatusBar != NULL)
			{
				float blend[4] = { 0, 0, 0, 0 };
				StatusBar->BlendView (blend);
			}
			screen->SetBlendingRect(viewwindowx, viewwindowy,
				viewwindowx + viewwidth, viewwindowy + viewheight);

			Renderer->RenderView(&players[consoleplayer]);

			if ((hw2d = screen->Begin2D(viewactive)))
			{
				// Redraw everything every frame when using 2D accel
				ST_SetNeedRefresh();
				V_SetBorderNeedRefresh();
			}
			Renderer->DrawRemainingPlayerSprites();
			screen->DrawBlendingRect();
			if (automapactive)
			{
				int saved_ST_Y = ST_Y;
				if (hud_althud && viewheight == SCREENHEIGHT)
				{
					ST_Y = viewheight;
				}
				AM_Drawer ();
				ST_Y = saved_ST_Y;
			}
			if (!automapactive || viewactive)
			{
				V_RefreshViewBorder ();
			}

			if (hud_althud && viewheight == SCREENHEIGHT && screenblocks > 10)
			{
				StatusBar->DrawBottomStuff (HUD_AltHud);
				if (DrawFSHUD || automapactive) DrawHUD();
				StatusBar->Draw (HUD_AltHud);
				StatusBar->DrawTopStuff (HUD_AltHud);
			}
			else 
			if (viewheight == SCREENHEIGHT && viewactive && screenblocks > 10)
			{
				EHudState state = DrawFSHUD ? HUD_Fullscreen : HUD_None;
				StatusBar->DrawBottomStuff (state);
				StatusBar->Draw (state);
				StatusBar->DrawTopStuff (state);
			}
			else
			{
				StatusBar->DrawBottomStuff (HUD_StatusBar);
				StatusBar->Draw (HUD_StatusBar);
				StatusBar->DrawTopStuff (HUD_StatusBar);
			}
			CT_Drawer ();
			break;

		case GS_INTERMISSION:
			screen->SetBlendingRect(0,0,0,0);
			hw2d = screen->Begin2D(false);
			WI_Drawer ();
			CT_Drawer ();
			break;

		case GS_FINALE:
			screen->SetBlendingRect(0,0,0,0);
			hw2d = screen->Begin2D(false);
			F_Drawer ();
			CT_Drawer ();
			break;

		case GS_DEMOSCREEN:
			screen->SetBlendingRect(0,0,0,0);
			hw2d = screen->Begin2D(false);
			D_PageDrawer ();
			CT_Drawer ();
			break;

		default:
			break;
		}
	}
	// draw pause pic
	if ((paused || pauseext) && menuactive == MENU_Off)
	{
		FTexture *tex;
		int x;
		FString pstring = "By ";

		tex = TexMan(gameinfo.PauseSign);
		x = (SCREENWIDTH - tex->GetScaledWidth() * CleanXfac)/2 +
			tex->GetScaledLeftOffset() * CleanXfac;
		screen->DrawTexture (tex, x, 4, DTA_CleanNoMove, true, TAG_DONE);
		if (paused && multiplayer)
		{
			pstring += players[paused - 1].userinfo.GetName();
			screen->DrawText(SmallFont, CR_RED,
				(screen->GetWidth() - SmallFont->StringWidth(pstring)*CleanXfac) / 2,
				(tex->GetScaledHeight() * CleanYfac) + 4, pstring, DTA_CleanNoMove, true, TAG_DONE);
		}
	}

	// [RH] Draw icon, if any
	if (D_DrawIcon)
	{
		FTextureID picnum = TexMan.CheckForTexture (D_DrawIcon, FTexture::TEX_MiscPatch);

		D_DrawIcon = NULL;
		if (picnum.isValid())
		{
			FTexture *tex = TexMan[picnum];
			screen->DrawTexture (tex, 160 - tex->GetScaledWidth()/2, 100 - tex->GetScaledHeight()/2,
				DTA_320x200, true, TAG_DONE);
		}
		NoWipe = 10;
	}

	if (snd_drawoutput)
	{
		GSnd->DrawWaveDebug(snd_drawoutput);
	}

	if (!wipe || NoWipe < 0)
	{
		NetUpdate ();			// send out any new accumulation
		// normal update
		C_DrawConsole (hw2d);	// draw console
		M_Drawer ();			// menu is drawn even on top of everything
		FStat::PrintStat ();
		screen->Update ();		// page flip or blit buffer
	}
	else
	{
		// wipe update
		unsigned int wipestart, nowtime, diff;
		bool done;

		GSnd->SetSfxPaused(true, 1);
		I_FreezeTime(true);
		screen->WipeEndScreen ();

		wipestart = I_MSTime();
		NetUpdate();		// send out any new accumulation

		do
		{
			do
			{
				I_WaitVBL(2);
				nowtime = I_MSTime();
				diff = (nowtime - wipestart) * 40 / 1000;	// Using 35 here feels too slow.
			} while (diff < 1);
			wipestart = nowtime;
			done = screen->WipeDo (1);
			C_DrawConsole (hw2d);	// console and
			M_Drawer ();			// menu are drawn even on top of wipes
			screen->Update ();		// page flip or blit buffer
			NetUpdate ();			// [RH] not sure this is needed anymore
		} while (!done);
		screen->WipeCleanup();
		I_FreezeTime(false);
		GSnd->SetSfxPaused(false, 1);
	}

	cycles.Unclock();
	FrameCycles = cycles;
}